

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_GenerateKeyPair
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_ATTRIBUTE_PTR pPublicKeyTemplate,CK_ULONG ulPublicKeyAttributeCount,
          CK_ATTRIBUTE_PTR pPrivateKeyTemplate,CK_ULONG ulPrivateKeyAttributeCount,
          CK_OBJECT_HANDLE_PTR phPublicKey,CK_OBJECT_HANDLE_PTR phPrivateKey)

{
  CK_MECHANISM_TYPE CVar1;
  CK_BBOOL isPrivateKeyPrivate;
  CK_BBOOL isPrivateKeyOnToken;
  CK_BBOOL isPublicKeyOnToken;
  CK_STATE sessionState;
  int lineNo;
  char *format;
  CK_RV CVar2;
  CK_BBOOL isprivateKeyPrivate;
  CK_BBOOL isprivateKeyToken;
  CK_BBOOL ispublicKeyPrivate;
  CK_BBOOL ispublicKeyToken;
  Session *local_60;
  CK_KEY_TYPE keyType;
  CK_SESSION_HANDLE local_50;
  CK_OBJECT_CLASS privateKeyClass;
  CK_OBJECT_CLASS publicKeyClass;
  CK_CERTIFICATE_TYPE dummy;
  
  CVar2 = 400;
  if ((((this->isInitialised == true) && (CVar2 = 7, pMechanism != (CK_MECHANISM_PTR)0x0)) &&
      (pPublicKeyTemplate != (CK_ATTRIBUTE_PTR)0x0 || ulPublicKeyAttributeCount == 0)) &&
     ((phPrivateKey != (CK_OBJECT_HANDLE_PTR)0x0 && phPublicKey != (CK_OBJECT_HANDLE_PTR)0x0) &&
      (ulPrivateKeyAttributeCount == 0 || pPrivateKeyTemplate != (CK_ATTRIBUTE_PTR)0x0))) {
    local_50 = hSession;
    local_60 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (local_60 == (Session *)0x0) {
      CVar2 = 0xb3;
    }
    else {
      CVar1 = pMechanism->mechanism;
      if ((long)CVar1 < 0x20) {
        if (CVar1 == 0) {
          keyType = 0;
        }
        else {
          if (CVar1 != 0x10) {
            return 0x70;
          }
          keyType = 1;
        }
      }
      else if (CVar1 == 0x20) {
        keyType = 2;
      }
      else if (CVar1 == 0x1040) {
        keyType = 3;
      }
      else {
        if (CVar1 != 0x1055) {
          return 0x70;
        }
        keyType = 0x40;
      }
      publicKeyClass = 2;
      ispublicKeyToken = '\0';
      ispublicKeyPrivate = '\0';
      extractObjectInformation
                (pPublicKeyTemplate,ulPublicKeyAttributeCount,&publicKeyClass,&keyType,&dummy,
                 &ispublicKeyToken,&ispublicKeyPrivate,true);
      CVar2 = 0x13;
      if ((((publicKeyClass == 2) && (CVar2 = 0xd1, CVar1 != 0 || keyType == 0)) &&
          ((CVar1 != 0x10 || keyType == 1 &&
           ((CVar1 != 0x1040 || keyType == 3 && (CVar1 != 0x20 || keyType == 2)))))) &&
         ((CVar1 != 0x1200 || keyType == 0x30 && (CVar1 != 0x1055 || keyType == 0x40)))) {
        privateKeyClass = 3;
        isprivateKeyToken = '\0';
        isprivateKeyPrivate = '\x01';
        extractObjectInformation
                  (pPrivateKeyTemplate,ulPrivateKeyAttributeCount,&privateKeyClass,&keyType,&dummy,
                   &isprivateKeyToken,&isprivateKeyPrivate,true);
        CVar2 = 0x13;
        if (privateKeyClass == 3) {
          CVar2 = 0xd1;
          if (((((CVar1 != 0 || keyType == 0) && (CVar1 != 0x10 || keyType == 1)) &&
               (CVar1 != 0x1040 || keyType == 3)) &&
              ((CVar1 != 0x20 || keyType == 2 && (CVar1 != 0x1200 || keyType == 0x30)))) &&
             (CVar1 != 0x1055 || keyType == 0x40)) {
            sessionState = Session::getState(local_60);
            isPublicKeyOnToken = ispublicKeyToken;
            isPrivateKeyOnToken = isprivateKeyToken;
            isPrivateKeyPrivate = isprivateKeyPrivate;
            local_60 = (Session *)CONCAT71(local_60._1_7_,ispublicKeyPrivate);
            CVar2 = haveWrite(sessionState,ispublicKeyToken != '\0' || isprivateKeyToken != '\0',
                              ispublicKeyPrivate != '\0' || isprivateKeyPrivate != '\0');
            if (CVar2 == 0) {
              CVar1 = pMechanism->mechanism;
              CVar2 = 5;
              if ((long)CVar1 < 0x1040) {
                if (CVar1 == 0) {
                  CVar2 = generateRSA(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                      pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                      phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                      isPrivateKeyOnToken,isPrivateKeyPrivate);
                }
                else if (CVar1 == 0x10) {
                  CVar2 = generateDSA(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                      pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                      phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                      isPrivateKeyOnToken,isPrivateKeyPrivate);
                }
                else if (CVar1 == 0x20) {
                  CVar2 = generateDH(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                     pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                     phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                     isPrivateKeyOnToken,isPrivateKeyPrivate);
                }
              }
              else if (CVar1 == 0x1040) {
                CVar2 = generateEC(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                   pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                   phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                   isPrivateKeyOnToken,isPrivateKeyPrivate);
              }
              else if (CVar1 == 0x1055) {
                CVar2 = generateED(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                   pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                   phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                   isPrivateKeyOnToken,isPrivateKeyPrivate);
              }
              else if (CVar1 == 0x1200) {
                CVar2 = generateGOST(this,local_50,pPublicKeyTemplate,ulPublicKeyAttributeCount,
                                     pPrivateKeyTemplate,ulPrivateKeyAttributeCount,phPublicKey,
                                     phPrivateKey,isPublicKeyOnToken,(CK_BBOOL)local_60,
                                     isPrivateKeyOnToken,isPrivateKeyPrivate);
              }
            }
            else {
              if (CVar2 == 0xb5) {
                format = "Session is read-only";
                lineNo = 0x17df;
              }
              else {
                if (CVar2 != 0x101) {
                  return CVar2;
                }
                format = "User is not authorized";
                lineNo = 0x17dd;
              }
              softHSMLog(6,"C_GenerateKeyPair",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,lineNo,format);
            }
          }
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::C_GenerateKeyPair
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pPublicKeyTemplate == NULL_PTR && ulPublicKeyAttributeCount != 0) return CKR_ARGUMENTS_BAD;
	if (pPrivateKeyTemplate == NULL_PTR && ulPrivateKeyAttributeCount != 0) return CKR_ARGUMENTS_BAD;
	if (phPublicKey == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phPrivateKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check the mechanism, only accept RSA, DSA, EC and DH key pair generation.
	CK_KEY_TYPE keyType;
	switch (pMechanism->mechanism)
	{
		case CKM_RSA_PKCS_KEY_PAIR_GEN:
			keyType = CKK_RSA;
			break;
		case CKM_DSA_KEY_PAIR_GEN:
			keyType = CKK_DSA;
			break;
		case CKM_DH_PKCS_KEY_PAIR_GEN:
			keyType = CKK_DH;
			break;
#ifdef WITH_ECC
		case CKM_EC_KEY_PAIR_GEN:
			keyType = CKK_EC;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410_KEY_PAIR_GEN:
			keyType = CKK_GOSTR3410;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EC_EDWARDS_KEY_PAIR_GEN:
			keyType = CKK_EC_EDWARDS;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}
	CK_CERTIFICATE_TYPE dummy;

	// Extract information from the public key template that is needed to create the object.
	CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
	CK_BBOOL ispublicKeyToken = CK_FALSE;
	CK_BBOOL ispublicKeyPrivate = CK_FALSE;
	bool isPublicKeyImplicit = true;
	extractObjectInformation(pPublicKeyTemplate, ulPublicKeyAttributeCount, publicKeyClass, keyType, dummy, ispublicKeyToken, ispublicKeyPrivate, isPublicKeyImplicit);

	// Report errors caused by accidental template mix-ups in the application using this cryptoki lib.
	if (publicKeyClass != CKO_PUBLIC_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN && keyType != CKK_RSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN && keyType != CKK_DSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN && keyType != CKK_EC)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN && keyType != CKK_DH)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN && keyType != CKK_GOSTR3410)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN && keyType != CKK_EC_EDWARDS)
		return CKR_TEMPLATE_INCONSISTENT;

	// Extract information from the private key template that is needed to create the object.
	CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
	CK_BBOOL isprivateKeyToken = CK_FALSE;
	CK_BBOOL isprivateKeyPrivate = CK_TRUE;
	bool isPrivateKeyImplicit = true;
	extractObjectInformation(pPrivateKeyTemplate, ulPrivateKeyAttributeCount, privateKeyClass, keyType, dummy, isprivateKeyToken, isprivateKeyPrivate, isPrivateKeyImplicit);

	// Report errors caused by accidental template mix-ups in the application using this cryptoki lib.
	if (privateKeyClass != CKO_PRIVATE_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN && keyType != CKK_RSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN && keyType != CKK_DSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN && keyType != CKK_EC)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN && keyType != CKK_DH)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN && keyType != CKK_GOSTR3410)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN && keyType != CKK_EC_EDWARDS)
		return CKR_TEMPLATE_INCONSISTENT;

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), ispublicKeyToken || isprivateKeyToken, ispublicKeyPrivate || isprivateKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Generate RSA keys
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN)
	{
			return this->generateRSA(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate DSA keys
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN)
	{
			return this->generateDSA(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate EC keys
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN)
	{
			return this->generateEC(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate DH keys
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN)
	{
			return this->generateDH(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate GOST keys
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN)
	{
			return this->generateGOST(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate EDDSA keys
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN)
	{
			return this->generateED(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	return CKR_GENERAL_ERROR;
}